

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O1

int x509_get_subject_key_id(uchar **p,uchar *end,mbedtls_x509_buf *subject_key_id)

{
  uchar *puVar1;
  int iVar2;
  size_t local_28;
  size_t len;
  
  local_28 = 0;
  iVar2 = mbedtls_asn1_get_tag(p,end,&local_28,4);
  if (iVar2 == 0) {
    subject_key_id->len = local_28;
    subject_key_id->tag = 4;
    subject_key_id->p = *p;
    puVar1 = *p;
    *p = puVar1 + local_28;
    iVar2 = -0x2566;
    if (puVar1 + local_28 == end) {
      iVar2 = 0;
    }
  }
  else {
    iVar2 = iVar2 + -0x2500;
  }
  return iVar2;
}

Assistant:

static int x509_get_subject_key_id(unsigned char **p,
                                   const unsigned char *end,
                                   mbedtls_x509_buf *subject_key_id)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0u;

    if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                    MBEDTLS_ASN1_OCTET_STRING)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
    }

    subject_key_id->len = len;
    subject_key_id->tag = MBEDTLS_ASN1_OCTET_STRING;
    subject_key_id->p = *p;
    *p += len;

    if (*p != end) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    return 0;
}